

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_queue.cpp
# Opt level: O3

ssize_t __thiscall mpt::io::queue::read(queue *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  long lVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  
  sVar3 = CONCAT44(in_register_00000034,__fd);
  if (sVar3 == 0) {
    sVar3 = 0;
  }
  else {
    lVar2 = 0;
    do {
      lVar1 = mpt_qpop(&this->_d,__nbytes,__buf);
      if (lVar1 == 0) {
        return lVar2;
      }
      lVar2 = lVar2 + 1;
      __buf = (void *)((long)__buf + __nbytes);
    } while (sVar3 != lVar2);
  }
  return sVar3;
}

Assistant:

ssize_t io::queue::read(size_t len, void *d, size_t part)
{
	size_t done = 0;
	while (done < len) {
		if (!mpt_qpop(&_d, part, d)) {
			return done;
		}
		++done;
		d = ((char *) d) + part;
	}
	return len;
}